

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_read.c
# Opt level: O2

size_t mpt_message_read(mpt_message *msg,size_t len,void *dest)

{
  iovec *piVar1;
  size_t sVar2;
  void *__src;
  size_t __n;
  
  __n = msg->used;
  sVar2 = 0;
  while( true ) {
    if (len < __n || len - __n == 0) {
      if (len != 0) {
        __src = msg->base;
        if (dest != (void *)0x0) {
          memcpy(dest,__src,len);
          __n = msg->used;
          __src = msg->base;
        }
        msg->base = (void *)((long)__src + len);
        __n = __n - len;
        msg->used = __n;
      }
      while ((__n == 0 && (msg->clen != 0))) {
        piVar1 = msg->cont;
        __n = piVar1->iov_len;
        msg->used = __n;
        msg->base = piVar1->iov_base;
        msg->cont = piVar1 + 1;
        msg->clen = msg->clen - 1;
      }
      return sVar2 + len;
    }
    if (__n != 0) {
      if (dest == (void *)0x0) {
        dest = (void *)0x0;
      }
      else {
        memcpy(dest,msg->base,__n);
        dest = (void *)((long)dest + __n);
      }
      sVar2 = sVar2 + __n;
      len = len - __n;
    }
    if (msg->clen == 0) break;
    piVar1 = msg->cont;
    __n = piVar1->iov_len;
    msg->used = __n;
    msg->base = piVar1->iov_base;
    msg->cont = piVar1 + 1;
    msg->clen = msg->clen - 1;
  }
  msg->base = (void *)((long)msg->base + __n);
  msg->used = msg->used - __n;
  return sVar2;
}

Assistant:

extern size_t mpt_message_read(MPT_STRUCT(message) *msg, size_t len, void *dest)
{
	size_t total = 0, part;
	
	while (len > (part = msg->used)) {
		if (part) {
			if (dest) {
				memcpy(dest, msg->base, part);
				dest = ((uint8_t *) dest) + part;
			}
			total += part;
			len   -= part;
		}
		if (!msg->clen) {
			msg->base = ((uint8_t *) msg->base) + part;
			msg->used -= part;
			return total;
		}
		msg->used = msg->cont->iov_len;
		msg->base = msg->cont->iov_base;
		++msg->cont;
		--msg->clen;
	}
	if (len) {
		if (dest) memcpy(dest, msg->base, len);
		msg->base = ((uint8_t *) msg->base) + len;
		msg->used -= len;
	}
	while (!msg->used && msg->clen) {
		msg->used = msg->cont->iov_len;
		msg->base = msg->cont->iov_base;
		++msg->cont;
		--msg->clen;
	}
	
	return total + len;
}